

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rearrangeFunctions.cpp
# Opt level: O1

void __thiscall GraphSam::swap(GraphSam *this,int a,int b)

{
  pointer psVar1;
  pointer psVar2;
  element_type *peVar3;
  element_type *peVar4;
  pointer psVar5;
  pointer psVar6;
  
  if (a != b) {
    psVar2 = (this->m_nodes).
             super__Vector_base<std::shared_ptr<GraphNode>,_std::allocator<std::shared_ptr<GraphNode>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    psVar1 = (this->m_nodes).
             super__Vector_base<std::shared_ptr<GraphNode>,_std::allocator<std::shared_ptr<GraphNode>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    for (psVar5 = psVar1; psVar5 != psVar2; psVar5 = psVar5 + 1) {
      peVar3 = (psVar5->super___shared_ptr<GraphNode,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      psVar6 = psVar1;
      if (peVar3->m_value == a) {
        do {
          peVar4 = (psVar6->super___shared_ptr<GraphNode,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
          if (peVar4->m_value == b) {
            peVar3->m_value = b;
            peVar4->m_value = a;
            return;
          }
          psVar6 = psVar6 + 1;
        } while (psVar6 != psVar2);
      }
    }
  }
  return;
}

Assistant:

void GraphSam::swap(int a, int b) {

    if (a == b) return;

    for (auto &n : m_nodes) {
        if (n->getValue() == a) {
            for (auto &m : m_nodes) {
                if (m->getValue() == b) {
                    n->setValue(b);
                    m->setValue(a);
                    return;
                }
            }
        }
    }

}